

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-rinex.c
# Opt level: O2

int handle_observation_definition(ingest_info *info,char *line)

{
  long *plVar1;
  byte bVar2;
  char *pcVar3;
  int iVar4;
  coda_type_record *pcVar5;
  coda_type_record_field *pcVar6;
  long lVar7;
  long lVar8;
  coda_mem_record *pcVar9;
  coda_mem_data *pcVar10;
  void *pvVar11;
  long lVar12;
  ulong uVar13;
  coda_type_array *type;
  int iVar14;
  ulong uVar15;
  char *pcVar16;
  long lStack_90;
  char str [4];
  int64_t num_types;
  char *local_78;
  coda_mem_array *local_70;
  coda_mem_record *local_68;
  long local_60;
  ulong local_58;
  char *local_50;
  char *local_48;
  long *local_40;
  ulong local_38;
  
  bVar2 = *line;
  if (bVar2 == 0x45) {
    pcVar16 = "galileo";
    lStack_90 = 0x78;
  }
  else if (bVar2 == 0x47) {
    pcVar16 = "gps";
    lStack_90 = 0x18;
  }
  else if (bVar2 == 0x53) {
    pcVar16 = "sbas";
    lStack_90 = 0xa8;
  }
  else {
    if (bVar2 != 0x52) {
      coda_set_error(-0x16,
                     "invalid satellite system for observation type definition (line: %ld, byte offset: %ld)"
                     ,info->linenumber,info->offset);
      return -1;
    }
    pcVar16 = "glonass";
    lStack_90 = 0x48;
  }
  if (*(long *)((long)&info->header + lStack_90) == 0) {
    pcVar5 = coda_type_record_new(coda_format_rinex);
    *(coda_type_record **)((long)&info->header + lStack_90) = pcVar5;
    pcVar6 = coda_type_record_field_new("number");
    local_78 = line;
    lVar7 = __tls_get_addr(&PTR_001d8d10);
    coda_type_record_field_set_type(pcVar6,*(coda_type **)(*(long *)(lVar7 + 0x1118) + 0x180));
    pcVar3 = local_78;
    coda_type_record_add_field(*(coda_type_record **)((long)&info->header + lStack_90),pcVar6);
    lVar8 = coda_ascii_parse_int64(pcVar3 + 3,3,&num_types,0);
    if (-1 < lVar8) {
      plVar1 = (long *)(lVar7 + 0x1118);
      local_50 = pcVar16;
      pcVar9 = coda_mem_record_new(*(coda_type_record **)(*plVar1 + 0xf8),(coda_dynamic_type *)0x0);
      pcVar10 = coda_mem_char_new(*(coda_type_text **)(*plVar1 + 0xd8),(coda_dynamic_type *)0x0,
                                  info->product,*pcVar3);
      coda_mem_record_add_field(pcVar9,"code",(coda_dynamic_type *)pcVar10,0);
      pcVar10 = coda_mem_int16_new(*(coda_type_number **)(*plVar1 + 0xe0),(coda_dynamic_type *)0x0,
                                   info->product,(int16_t)num_types);
      coda_mem_record_add_field(pcVar9,"num_obs_types",(coda_dynamic_type *)pcVar10,0);
      local_40 = plVar1;
      local_70 = coda_mem_array_new(*(coda_type_array **)(*plVar1 + 0xf0),(coda_dynamic_type *)0x0);
      lVar7 = CONCAT62(num_types._2_6_,(int16_t)num_types);
      pvVar11 = malloc(lVar7 * 8);
      *(void **)((long)&info->product + lStack_90) = pvVar11;
      if (pvVar11 == (void *)0x0) {
        coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",lVar7 * 8,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-rinex.c"
                       ,0x776);
        return -1;
      }
      *(int *)((long)&info->f + lStack_90) = (int)lVar7;
      lVar12 = 0;
      lVar8 = 0;
      if (0 < lVar7) {
        lVar8 = lVar7;
      }
      for (; lVar8 != lVar12; lVar12 = lVar12 + 1) {
        *(undefined8 *)(*(long *)((long)&info->product + lStack_90) + lVar12 * 8) = 0;
      }
      local_48 = local_78 + 7;
      local_58 = 0;
      uVar15 = 0;
      lVar8 = 0;
      local_68 = pcVar9;
      local_60 = lStack_90;
      do {
        pcVar9 = local_68;
        if (lVar7 <= (long)uVar15) {
          coda_mem_record_add_field(local_68,"descriptor",(coda_dynamic_type *)local_70,0);
          coda_mem_array_add_element(info->sys_array,(coda_dynamic_type *)pcVar9);
          type = coda_type_array_new(coda_format_rinex);
          lVar7 = local_60;
          *(coda_type_array **)((long)&(info->gps).num_observables + local_60) = type;
          coda_type_array_add_variable_dimension(type,(coda_expression *)0x0);
          coda_type_array_set_base_type
                    (*(coda_type_array **)((long)&(info->gps).num_observables + lVar7),
                     *(coda_type **)((long)&info->header + lVar7));
          pcVar6 = coda_type_record_field_new(local_50);
          coda_type_record_field_set_type
                    (pcVar6,*(coda_type **)((long)&(info->gps).num_observables + lVar7));
          coda_type_record_add_field(info->epoch_record_definition,pcVar6);
          return 0;
        }
        iVar14 = (int)((uVar15 & 0xffffffff) / 0xd);
        if ((lVar8 != 0) && (iVar14 * -0xd == (int)lVar8)) {
          lVar7 = ftell((FILE *)info->f);
          info->offset = lVar7;
          info->linenumber = info->linenumber + 1;
          iVar4 = get_line(info->f,local_78);
          if (iVar4 < 0) {
            coda_dynamic_type_delete((coda_dynamic_type *)local_68);
            coda_dynamic_type_delete((coda_dynamic_type *)local_70);
            return -1;
          }
          lVar12 = lVar8 + CONCAT62(num_types._2_6_,(int16_t)num_types);
          lVar7 = 0x3a;
          if (lVar12 < 0xd) {
            lVar7 = (lVar12 % 0xd) * 4 + 6;
          }
          if (iVar4 < lVar7) {
            coda_set_error(-0x16,"header line length (%ld) too short (line: %ld, byte offset: %ld)",
                           (long)iVar4,info->linenumber,info->offset);
            return -1;
          }
        }
        plVar1 = local_40;
        iVar4 = (int)local_58;
        uVar13 = (ulong)(uint)(iVar4 + iVar14 * -0x34);
        str[2] = local_48[uVar13 + 2];
        str._0_2_ = *(undefined2 *)(local_48 + uVar13);
        str[3] = '\0';
        local_38 = uVar15;
        pcVar10 = coda_mem_string_new(*(coda_type_text **)(*local_40 + 0xe8),
                                      (coda_dynamic_type *)0x0,info->product,str);
        coda_mem_array_add_element(local_70,(coda_dynamic_type *)pcVar10);
        pcVar6 = coda_type_record_field_new(str);
        coda_type_record_field_set_type(pcVar6,*(coda_type **)(*plVar1 + 0x1a0));
        lVar7 = local_60;
        coda_type_record_add_field(*(coda_type_record **)((long)&info->header + local_60),pcVar6);
        uVar15 = local_38;
        pcVar16 = strdup(str);
        *(char **)(*(long *)((long)&info->product + lVar7) + uVar15 * 8) = pcVar16;
        if (*(long *)(*(long *)((long)&info->product + lVar7) + uVar15 * 8) == 0) {
          coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-rinex.c"
                         ,0x7ab);
          return -1;
        }
        uVar15 = uVar15 + 1;
        lVar7 = CONCAT62(num_types._2_6_,(int16_t)num_types);
        local_58 = (ulong)(iVar4 + 4);
        lVar8 = lVar8 + -1;
      } while( true );
    }
    coda_add_error_message(" (line: %ld, byte offset: %ld)",info->linenumber,info->offset + 3);
  }
  else {
    coda_set_error(-0x16,
                   "multiple observation type definitions for type \'%c\' (line: %ld, byte offset: %ld)"
                   ,(ulong)bVar2,info->linenumber,info->offset);
  }
  return -1;
}

Assistant:

static int handle_observation_definition(ingest_info *info, char *line)
{
    satellite_info *sat_info;
    coda_type_record_field *field;
    coda_dynamic_type *value;
    coda_mem_record *sys;
    coda_mem_array *descriptor_array;
    const char *fieldname = NULL;
    int64_t num_types;
    int i;

    switch (line[0])
    {
        case 'G':      /* GPS */
            sat_info = &info->gps;
            fieldname = "gps";
            break;
        case 'R':      /* GLONASS */
            sat_info = &info->glonass;
            fieldname = "glonass";
            break;
        case 'E':      /* Galileo */
            sat_info = &info->galileo;
            fieldname = "galileo";
            break;
        case 'S':      /* SBAS */
            sat_info = &info->sbas;
            fieldname = "sbas";
            break;
        default:
            coda_set_error(CODA_ERROR_FILE_READ, "invalid satellite system for observation type definition "
                           "(line: %ld, byte offset: %ld)", info->linenumber, info->offset);
            return -1;
    }

    if (sat_info->sat_obs_definition != NULL)
    {
        coda_set_error(CODA_ERROR_FILE_READ, "multiple observation type definitions for type '%c' "
                       "(line: %ld, byte offset: %ld)", line[0], info->linenumber, info->offset);
        return -1;
    }
    sat_info->sat_obs_definition = coda_type_record_new(coda_format_rinex);
    field = coda_type_record_field_new("number");
    coda_type_record_field_set_type(field, rinex_type[rinex_satellite_number]);
    coda_type_record_add_field(sat_info->sat_obs_definition, field);

    if (coda_ascii_parse_int64(&line[3], 3, &num_types, 0) < 0)
    {
        coda_add_error_message(" (line: %ld, byte offset: %ld)", info->linenumber, info->offset + 3);
        return -1;
    }
    sys = coda_mem_record_new((coda_type_record *)rinex_type[rinex_sys], NULL);
    value = (coda_dynamic_type *)coda_mem_char_new((coda_type_text *)rinex_type[rinex_sys_code], NULL, info->product,
                                                   line[0]);
    coda_mem_record_add_field(sys, "code", value, 0);
    value = (coda_dynamic_type *)coda_mem_int16_new((coda_type_number *)rinex_type[rinex_sys_num_obs_types],
                                                    NULL, info->product, (int16_t)num_types);
    coda_mem_record_add_field(sys, "num_obs_types", value, 0);
    descriptor_array = coda_mem_array_new((coda_type_array *)rinex_type[rinex_sys_descriptor_array], NULL);

    sat_info->observable = malloc((size_t)num_types * sizeof(char *));
    if (sat_info->observable == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)num_types * sizeof(char *), __FILE__, __LINE__);
        return -1;
    }
    sat_info->num_observables = (int)num_types;
    for (i = 0; i < num_types; i++)
    {
        sat_info->observable[i] = NULL;
    }

    for (i = 0; i < num_types; i++)
    {
        char str[4];

        if (i % 13 == 0 && i > 0)
        {
            long linelength;
            long expected_line_length = 6 + 13 * 4;

            /* read next line */
            info->offset = ftell(info->f);
            info->linenumber++;
            linelength = get_line(info->f, line);
            if (linelength < 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)sys);
                coda_dynamic_type_delete((coda_dynamic_type *)descriptor_array);
                return -1;
            }
            if (num_types - i < 13)
            {
                expected_line_length = 6 + ((num_types - i) % 13) * 4;
            }
            if (linelength < expected_line_length)
            {
                coda_set_error(CODA_ERROR_FILE_READ, "header line length (%ld) too short (line: %ld, byte offset: %ld)",
                               linelength, info->linenumber, info->offset);
                return -1;
            }
        }
        memcpy(str, &line[6 + (i % 13) * 4 + 1], 3);
        str[3] = '\0';
        value = (coda_dynamic_type *)coda_mem_string_new((coda_type_text *)rinex_type[rinex_sys_descriptor], NULL,
                                                         info->product, str);
        coda_mem_array_add_element(descriptor_array, value);

        field = coda_type_record_field_new(str);
        coda_type_record_field_set_type(field, rinex_type[rinex_observation_record]);
        coda_type_record_add_field(sat_info->sat_obs_definition, field);

        sat_info->observable[i] = strdup(str);
        if (sat_info->observable[i] == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                           __LINE__);
            return -1;
        }
    }

    /* update header */
    coda_mem_record_add_field(sys, "descriptor", (coda_dynamic_type *)descriptor_array, 0);
    coda_mem_array_add_element(info->sys_array, (coda_dynamic_type *)sys);

    /* update epoch record definition */
    sat_info->sat_obs_array_definition = coda_type_array_new(coda_format_rinex);
    coda_type_array_add_variable_dimension((coda_type_array *)sat_info->sat_obs_array_definition, NULL);
    coda_type_array_set_base_type(sat_info->sat_obs_array_definition, (coda_type *)sat_info->sat_obs_definition);

    field = coda_type_record_field_new(fieldname);
    coda_type_record_field_set_type(field, (coda_type *)sat_info->sat_obs_array_definition);
    coda_type_record_add_field(info->epoch_record_definition, field);

    return 0;
}